

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

int __thiscall
libcellml::Variable::clone
          (Variable *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Variable *pVVar1;
  Entity *this_00;
  NamedEntity *this_01;
  VariablePtr VVar2;
  string sStack_38;
  
  VVar2 = create();
  if (*(__fn **)(*(long *)(__fn + 8) + 0x110) != (__fn *)0x0) {
    pVVar1 = (Variable *)(this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
    Units::clone((Units *)&sStack_38,*(__fn **)(*(long *)(__fn + 8) + 0x110),
                 VVar2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi,__flags,__arg);
    setUnits(pVVar1,(UnitsPtr *)&sStack_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sStack_38._M_string_length);
  }
  pVVar1 = (Variable *)(this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
  initialValue_abi_cxx11_(&sStack_38,(Variable *)__fn);
  setInitialValue(pVVar1,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  pVVar1 = (Variable *)(this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
  interfaceType_abi_cxx11_(&sStack_38,(Variable *)__fn);
  setInterfaceType(pVVar1,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  this_00 = (Entity *)(this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
  Entity::id_abi_cxx11_(&sStack_38,(Entity *)__fn);
  Entity::setId(this_00,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  this_01 = (NamedEntity *)(this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
  NamedEntity::name_abi_cxx11_(&sStack_38,(NamedEntity *)__fn);
  NamedEntity::setName(this_01,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return (int)this;
}

Assistant:

VariablePtr Variable::clone() const
{
    auto v = create();

    if (pFunc()->mUnits != nullptr) {
        v->setUnits(pFunc()->mUnits->clone());
    }
    v->setInitialValue(initialValue());
    v->setInterfaceType(interfaceType());
    v->setId(id());
    v->setName(name());

    return v;
}